

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexHelper.cpp
# Opt level: O0

Var Js::RegexHelper::RegexEs6ReplaceImpl
              (ScriptContext *scriptContext,RecyclableObject *thisObj,JavascriptString *input,
              JavascriptString *replace,bool noResult)

{
  anon_class_24_3_69494f71 appendReplacement_00;
  Var pvVar1;
  anon_class_24_3_69494f71 appendReplacement;
  JavascriptString *pJStack_28;
  bool noResult_local;
  JavascriptString *replace_local;
  JavascriptString *input_local;
  RecyclableObject *thisObj_local;
  ScriptContext *scriptContext_local;
  
  appendReplacement_00.scriptContext = (ScriptContext **)&thisObj_local;
  appendReplacement_00.replace = &stack0xffffffffffffffd8;
  appendReplacement_00.input = &replace_local;
  pJStack_28 = replace;
  replace_local = input;
  input_local = (JavascriptString *)thisObj;
  thisObj_local = (RecyclableObject *)scriptContext;
  pvVar1 = RegexEs6ReplaceImpl<Js::RegexHelper::RegexEs6ReplaceImpl(Js::ScriptContext*,Js::RecyclableObject*,Js::JavascriptString*,Js::JavascriptString*,bool)::__0>
                     (scriptContext,thisObj,input,appendReplacement_00,noResult);
  return pvVar1;
}

Assistant:

Var RegexHelper::RegexEs6ReplaceImpl(ScriptContext* scriptContext, RecyclableObject* thisObj, JavascriptString* input, JavascriptString* replace, bool noResult)
    {
        auto appendReplacement = [&](
            CompoundString::Builder<64 * sizeof(void *) / sizeof(char16)>& resultBuilder,
            ArenaAllocator* tempAlloc,
            JavascriptString* matchStr,
            int numberOfCaptures,
            Field(Var)* captures,
            CharCount position)
        {
            CharCount* substitutionOffsets = nullptr;
            int substitutions = GetReplaceSubstitutions(
                replace->GetString(),
                replace->GetLength(),
                tempAlloc,
                &substitutionOffsets);
            auto getGroup = [&](int captureIndex, Var nonMatchValue) {
                return captureIndex <= numberOfCaptures ? PointerValue(captures[captureIndex]) : nonMatchValue;
            };
            UnifiedRegex::GroupInfo match(position, matchStr->GetLength());
            int numGroups = numberOfCaptures + 1; // Take group 0 into account.
            ReplaceFormatString(
                scriptContext,
                numGroups,
                getGroup,
                input,
                matchStr->GetString(),
                match,
                replace,
                substitutions,
                substitutionOffsets,
                resultBuilder);
        };
        return RegexEs6ReplaceImpl(scriptContext, thisObj, input, appendReplacement, noResult);
    }